

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file_(uchar **out,size_t *outsize,FILE *file)

{
  size_t sVar1;
  void *pvVar2;
  FILE *in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  long size;
  FILE *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  sVar1 = lodepng_filesize(in_stack_ffffffffffffffd8);
  if ((long)sVar1 < 0) {
    local_4 = 0x4e;
  }
  else {
    *in_RSI = sVar1;
    pvVar2 = lodepng_malloc(0x1bcf47);
    *in_RDI = (long)pvVar2;
    if ((*in_RDI == 0) && (0 < (long)sVar1)) {
      local_4 = 0x53;
    }
    else {
      sVar1 = fread((void *)*in_RDI,1,*in_RSI,in_RDX);
      if (sVar1 == *in_RSI) {
        local_4 = 0;
      }
      else {
        local_4 = 0x4e;
      }
    }
  }
  return local_4;
}

Assistant:

static unsigned lodepng_load_file_(unsigned char** out, size_t* outsize, FILE* file) {
  long size = lodepng_filesize(file);
  if(size < 0) return 78;
  *outsize = (size_t)size;
  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/
  if(fread(*out, 1, *outsize, file) != *outsize) return 78;
  return 0; /*ok*/
}